

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

LogicalTypeModifier *
duckdb::LogicalTypeModifier::Deserialize
          (LogicalTypeModifier *__return_storage_ptr__,Deserializer *deserializer)

{
  Value value;
  Value local_58;
  
  Deserializer::ReadProperty<duckdb::Value>(&value,deserializer,100,"value");
  Value::Value(&local_58,&value);
  LogicalTypeModifier(__return_storage_ptr__,&local_58);
  Value::~Value(&local_58);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x65,"label",&__return_storage_ptr__->label);
  Value::~Value(&value);
  return __return_storage_ptr__;
}

Assistant:

LogicalTypeModifier LogicalTypeModifier::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadProperty<Value>(100, "value");
	LogicalTypeModifier result(value);
	deserializer.ReadPropertyWithDefault<string>(101, "label", result.label);
	return result;
}